

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

uint32_t mjs::index_value_from_string(wstring_view *str)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint32_t last;
  value_type ch;
  uint32_t i;
  uint32_t index;
  size_type len;
  wstring_view *str_local;
  
  sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(str);
  if ((sVar3 == 0) || (10 < sVar3)) {
    if (sVar3 == 0) {
      __assert_fail("len",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string.cpp"
                    ,0x27,"uint32_t mjs::index_value_from_string(const std::wstring_view &)");
    }
    str_local._4_4_ = 0xffffffff;
  }
  else {
    ch = 0;
    for (last = 0; last < sVar3; last = last + 1) {
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         (str,(ulong)last);
      iVar1 = *pvVar4;
      if ((iVar1 < 0x30) || (0x39 < iVar1)) {
        return 0xffffffff;
      }
      uVar2 = ch * 10 + iVar1 + -0x30;
      if (uVar2 < (uint)ch) {
        return 0xffffffff;
      }
      ch = uVar2;
    }
    str_local._4_4_ = ch;
  }
  return str_local._4_4_;
}

Assistant:

uint32_t index_value_from_string(const std::wstring_view& str) {
    const auto len = str.length();
    if (len == 0 || len > 10) {
        assert(len); // Shouldn't be passed the empty string
        return invalid_index_value;
    }
    uint32_t index = 0;
    for (uint32_t i = 0; i < len; ++i) {
        const auto ch = str[i];
        if (ch < L'0' || ch > L'9') {
            return invalid_index_value;
        }
        const auto last = index;
        index = index*10 + (ch - L'0');
        if (index < last) {
            // Overflow
            return invalid_index_value;
        }
    }
    return index;
}